

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block.cc
# Opt level: O3

void __thiscall leveldb::Block::Iter::Prev(Iter *this)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  int iVar5;
  uint index;
  long in_FS_OFFSET;
  bool bVar6;
  
  lVar4 = *(long *)(in_FS_OFFSET + 0x28);
  iVar5 = (*(this->super_Iterator)._vptr_Iterator[2])();
  if ((char)iVar5 == '\0') {
    __assert_fail("Valid()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/leveldb/table/block.cc"
                  ,0x90,"virtual void leveldb::Block::Iter::Prev()");
  }
  uVar2 = this->num_restarts_;
  index = this->restart_index_;
  if (index < uVar2) {
    uVar3 = this->current_;
    uVar1 = index - 1;
    do {
      if (*(uint *)(this->data_ + (ulong)index * 4 + (ulong)this->restarts_) < uVar3) {
        SeekToRestartPoint(this,index);
        goto LAB_0065ac4f;
      }
      bVar6 = index == 0;
      index = index - 1;
      if (bVar6) {
        this->current_ = this->restarts_;
        this->restart_index_ = uVar2;
        goto LAB_0065ac70;
      }
      this->restart_index_ = index;
    } while (uVar1 < uVar2);
  }
  __assert_fail("index < num_restarts_",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/leveldb/table/block.cc"
                ,0x65,"uint32_t leveldb::Block::Iter::GetRestartPoint(uint32_t)");
  while ((uint)((*(int *)&(this->value_).data_ + (int)(this->value_).size_) - *(int *)&this->data_)
         < uVar3) {
LAB_0065ac4f:
    bVar6 = ParseNextKey(this);
    if (!bVar6) break;
  }
LAB_0065ac70:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar4) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void Prev() override {
    assert(Valid());

    // Scan backwards to a restart point before current_
    const uint32_t original = current_;
    while (GetRestartPoint(restart_index_) >= original) {
      if (restart_index_ == 0) {
        // No more entries
        current_ = restarts_;
        restart_index_ = num_restarts_;
        return;
      }
      restart_index_--;
    }

    SeekToRestartPoint(restart_index_);
    do {
      // Loop until end of current entry hits the start of original entry
    } while (ParseNextKey() && NextEntryOffset() < original);
  }